

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent)

{
  ImGuiWindow *potential_parent_local;
  ImGuiWindow *window_local;
  bool local_1;
  
  window_local = window;
  if (window->RootWindow == potential_parent) {
    local_1 = true;
  }
  else {
    for (; window_local != (ImGuiWindow *)0x0; window_local = window_local->ParentWindow) {
      if (window_local == potential_parent) {
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent)
{
    if (window->RootWindow == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        window = window->ParentWindow;
    }
    return false;
}